

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

bool __thiscall
lzham::search_accelerator::add_bytes_begin(search_accelerator *this,uint num_bytes,uint8 *pBytes)

{
  bool bVar1;
  uint i;
  uchar *puVar2;
  uchar *__src;
  void *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint max_possible_dict_size;
  uint add_pos;
  undefined4 in_stack_00000028;
  uint local_34;
  
  i = *(uint *)(in_RDI + 0x1c) & *(uint *)(in_RDI + 0x18);
  puVar2 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x28),i);
  memcpy(puVar2,in_RDX,(ulong)in_ESI);
  if (i < 0x101) {
    puVar2 = vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)(in_RDI + 0x28),*(uint *)(in_RDI + 0x14));
    __src = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x28),0);
    memcpy(puVar2,__src,0x101);
  }
  *(uint *)(in_RDI + 0x20) = in_ESI;
  local_34 = *(int *)(in_RDI + 0x14) - in_ESI;
  if (*(uint *)(in_RDI + 0x24) < local_34) {
    local_34 = *(uint *)(in_RDI + 0x24);
  }
  *(uint *)(in_RDI + 0x24) = local_34;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  bVar1 = find_all_matches((search_accelerator *)CONCAT44(num_bytes,in_stack_00000028),pBytes._4_4_)
  ;
  return bVar1;
}

Assistant:

bool search_accelerator::add_bytes_begin(uint num_bytes, const uint8* pBytes)
   {
      LZHAM_ASSERT(num_bytes <= m_max_dict_size);
      LZHAM_ASSERT(!m_lookahead_size);

      uint add_pos = m_lookahead_pos & m_max_dict_size_mask;
      LZHAM_ASSERT((add_pos + num_bytes) <= m_max_dict_size);

      memcpy(&m_dict[add_pos], pBytes, num_bytes);

      if (add_pos < CLZBase::cMaxMatchLen)
         memcpy(&m_dict[m_max_dict_size], &m_dict[0], CLZBase::cMaxMatchLen);

      m_lookahead_size = num_bytes;

      uint max_possible_dict_size = m_max_dict_size - num_bytes;
      m_cur_dict_size = LZHAM_MIN(m_cur_dict_size, max_possible_dict_size);

      m_next_match_ref = 0;

      return find_all_matches(num_bytes);
   }